

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O0

void __thiscall
de::SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset>::SharedPtr
          (SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *this,ContextReset *ptr)

{
  ContextReset *pCVar1;
  SharedPtrState<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  *pSVar2;
  DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset> local_25 [13];
  ContextReset *local_18;
  ContextReset *ptr_local;
  SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *this_local;
  
  this->m_ptr = (ContextReset *)0x0;
  this->m_state = (SharedPtrStateBase *)0x0;
  this->m_ptr = ptr;
  local_18 = ptr;
  ptr_local = (ContextReset *)this;
  pSVar2 = (SharedPtrState<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
            *)operator_new(0x20);
  pCVar1 = local_18;
  DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>::DefaultDeleter(local_25);
  SharedPtrState<deqp::egl::(anonymous_namespace)::ContextReset,_de::DefaultDeleter<deqp::egl::(anonymous_namespace)::ContextReset>_>
  ::SharedPtrState(pSVar2,pCVar1);
  this->m_state = (SharedPtrStateBase *)pSVar2;
  this->m_state->strongRefCount = 1;
  this->m_state->weakRefCount = 1;
  return;
}

Assistant:

inline SharedPtr<T>::SharedPtr (T* ptr)
	: m_ptr		(DE_NULL)
	, m_state	(DE_NULL)
{
	try
	{
		m_ptr	= ptr;
		m_state	= new SharedPtrState<T, DefaultDeleter<T> >(ptr, DefaultDeleter<T>());
		m_state->strongRefCount	= 1;
		m_state->weakRefCount	= 1;
	}
	catch (...)
	{
		// \note ptr is not released.
		delete m_state;
		throw;
	}
}